

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O0

string * spvTargetEnvList_abi_cxx11_(string *__return_storage_ptr__,int pad,int wrap)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string word;
  pair<const_char_*,_spv_target_env> *name_env;
  pair<const_char_*,_spv_target_env> *__end1;
  pair<const_char_*,_spv_target_env> *__begin1;
  pair<const_char_*,_spv_target_env> (*__range1) [25];
  undefined1 local_68 [8];
  string sep;
  string line;
  size_t max_line_len;
  int wrap_local;
  int pad_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  line.field_2._8_8_ = SEXT48(wrap - pad);
  std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"",(allocator<char> *)((long)&__range1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  for (__end1 = spvTargetEnvNameMap; (Elf64_Dyn *)__end1 != _DYNAMIC; __end1 = __end1 + 1) {
    word.field_2._8_8_ = __end1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   __end1->first);
    lVar1 = std::__cxx11::string::length();
    lVar2 = std::__cxx11::string::length();
    if ((ulong)line.field_2._8_8_ < (ulong)(lVar1 + lVar2)) {
      std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&sep.field_2 + 8),"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::assign((ulong)((long)&sep.field_2 + 8),(char)pad);
      line.field_2._8_8_ = SEXT48(wrap);
    }
    std::__cxx11::string::operator+=((string *)(sep.field_2._M_local_buf + 8),(string *)local_b0);
    std::__cxx11::string::operator=((string *)local_68,"|");
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)(sep.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string spvTargetEnvList(const int pad, const int wrap) {
  std::string ret;
  size_t max_line_len = wrap - pad;  // The first line isn't padded
  std::string line;
  std::string sep = "";

  for (auto& name_env : spvTargetEnvNameMap) {
    std::string word = sep + name_env.first;
    if (line.length() + word.length() > max_line_len) {
      // Adding one word wouldn't fit, commit the line in progress and
      // start a new one.
      ret += line + "\n";
      line.assign(pad, ' ');
      // The first line is done. The max length now comprises the
      // padding.
      max_line_len = wrap;
    }
    line += word;
    sep = "|";
  }

  ret += line;

  return ret;
}